

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O3

size_t mpn_get_str_other(uchar *sp,int base,mpn_base_info *info,mp_ptr up,mp_size_t un)

{
  uchar uVar1;
  mp_limb_t w;
  ulong uVar2;
  size_t sVar3;
  uchar *puVar4;
  long lVar5;
  gmp_div_inverse binv;
  gmp_div_inverse bbinv;
  gmp_div_inverse local_70;
  gmp_div_inverse local_50;
  
  mpn_div_qr_1_invert(&local_70,(long)base);
  if (un < 2) {
    lVar5 = 0;
  }
  else {
    mpn_div_qr_1_invert(&local_50,info->bb);
    lVar5 = 0;
    do {
      w = mpn_div_qr_1_preinv(up,up,un,&local_50);
      un = un - (ulong)(up[un + -1] == 0);
      for (uVar2 = mpn_limb_get_str(sp + lVar5,w,&local_70); uVar2 < info->exp; uVar2 = uVar2 + 1) {
        (sp + lVar5)[uVar2] = '\0';
      }
      lVar5 = lVar5 + uVar2;
    } while (1 < un);
  }
  sVar3 = mpn_limb_get_str(sp + lVar5,*up,&local_70);
  sVar3 = sVar3 + lVar5;
  if (1 < sVar3) {
    uVar2 = 0;
    puVar4 = sp;
    do {
      uVar1 = *puVar4;
      *puVar4 = sp[uVar2 + (sVar3 - 1)];
      sp[uVar2 + (sVar3 - 1)] = uVar1;
      uVar2 = uVar2 - 1;
      puVar4 = puVar4 + 1;
    } while (~(sVar3 - 2 >> 1) != uVar2);
  }
  return sVar3;
}

Assistant:

static size_t
mpn_get_str_other (unsigned char *sp,
		   int base, const struct mpn_base_info *info,
		   mp_ptr up, mp_size_t un)
{
  struct gmp_div_inverse binv;
  size_t sn;
  size_t i;

  mpn_div_qr_1_invert (&binv, base);

  sn = 0;

  if (un > 1)
    {
      struct gmp_div_inverse bbinv;
      mpn_div_qr_1_invert (&bbinv, info->bb);

      do
	{
	  mp_limb_t w;
	  size_t done;
	  w = mpn_div_qr_1_preinv (up, up, un, &bbinv);
	  un -= (up[un-1] == 0);
	  done = mpn_limb_get_str (sp + sn, w, &binv);

	  for (sn += done; done < info->exp; done++)
	    sp[sn++] = 0;
	}
      while (un > 1);
    }
  sn += mpn_limb_get_str (sp + sn, up[0], &binv);

  /* Reverse order */
  for (i = 0; 2*i + 1 < sn; i++)
    {
      unsigned char t = sp[i];
      sp[i] = sp[sn - i - 1];
      sp[sn - i - 1] = t;
    }

  return sn;
}